

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visualizer.cc
# Opt level: O3

void features::Visualizer::draw_keypoint
               (ByteImage *image,Keypoint *keypoint,KeypointStyle style,uint8_t *color)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  iVar3 = (int)(keypoint->x + 0.5);
  if (iVar3 < 0) {
    return;
  }
  iVar2 = (image->super_TypedImageBase<unsigned_char>).super_ImageBase.w;
  if (iVar2 <= iVar3) {
    return;
  }
  iVar5 = (int)(keypoint->y + 0.5);
  if (iVar5 < 0) {
    return;
  }
  iVar4 = (image->super_TypedImageBase<unsigned_char>).super_ImageBase.h;
  if (iVar4 <= iVar5) {
    return;
  }
  iVar6 = (image->super_TypedImageBase<unsigned_char>).super_ImageBase.c;
  if (style == RADIUS_BOX_ORIENTATION) {
    fVar9 = keypoint->radius;
    fVar9 = (fVar9 + fVar9) * fVar9;
    if (fVar9 < 0.0) {
      fVar9 = sqrtf(fVar9);
    }
    else {
      fVar9 = SQRT(fVar9);
    }
    iVar7 = (int)fVar9 + 1;
LAB_001098b9:
    bVar8 = true;
  }
  else {
    if (style == RADIUS_CIRCLE_ORIENTATION) {
      iVar7 = (int)keypoint->radius;
      goto LAB_001098b9;
    }
    bVar8 = false;
    iVar7 = 0;
    if (style == SMALL_CIRCLE_STATIC) {
      iVar7 = 3;
      bVar8 = false;
    }
  }
  if ((((iVar3 < iVar7) || (iVar2 - iVar7 <= iVar3)) || (iVar5 < iVar7)) || (iVar4 - iVar7 <= iVar5)
     ) {
    if (iVar6 == 0) {
      return;
    }
    bVar8 = false;
  }
  else {
    if (style == RADIUS_BOX_ORIENTATION) {
      fVar9 = keypoint->x;
      fVar10 = keypoint->y;
      fVar1 = keypoint->radius;
      fVar12 = keypoint->orientation;
      fVar11 = sinf(fVar12);
      fVar12 = cosf(fVar12);
      fVar13 = fVar12 * -fVar1;
      fVar16 = fVar13 + fVar1 * fVar11;
      fVar14 = -fVar1 * fVar11;
      fVar12 = fVar12 * fVar1;
      fVar15 = fVar1 * fVar11 + fVar12;
      iVar5 = (int)(fVar9 + fVar16 + 0.5);
      iVar3 = (int)(fVar14 + fVar13 + fVar10 + 0.5);
      iVar6 = (int)(fVar9 + fVar15 + 0.5);
      iVar2 = (int)(fVar16 + fVar10 + 0.5);
      core::image::draw_line<unsigned_char>(image,iVar5,iVar3,iVar6,iVar2,color);
      iVar7 = (int)(fVar12 + -fVar11 * fVar1 + fVar9 + 0.5);
      iVar4 = (int)(fVar15 + fVar10 + 0.5);
      core::image::draw_line<unsigned_char>(image,iVar6,iVar2,iVar7,iVar4,color);
      iVar2 = (int)(-fVar11 * fVar1 + fVar13 + fVar9 + 0.5);
      iVar6 = (int)(fVar14 + fVar12 + fVar10 + 0.5);
      core::image::draw_line<unsigned_char>(image,iVar7,iVar4,iVar2,iVar6,color);
      core::image::draw_line<unsigned_char>(image,iVar2,iVar6,iVar5,iVar3,color);
      goto joined_r0x00109be3;
    }
    if (style == RADIUS_CIRCLE_ORIENTATION) {
      core::image::draw_circle<unsigned_char>(image,iVar3,iVar5,iVar7,color);
      goto joined_r0x00109be3;
    }
    if (style == SMALL_CIRCLE_STATIC) {
      core::image::draw_circle<unsigned_char>(image,iVar3,iVar5,3,color);
      goto joined_r0x00109be3;
    }
    if (iVar6 == 0) goto joined_r0x00109be3;
  }
  memmove((image->super_TypedImageBase<unsigned_char>).data.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start +
          (long)(iVar5 * (image->super_TypedImageBase<unsigned_char>).super_ImageBase.w + iVar3) *
          (long)(image->super_TypedImageBase<unsigned_char>).super_ImageBase.c,color,(long)iVar6);
joined_r0x00109be3:
  if (!bVar8) {
    return;
  }
  fVar9 = sinf(keypoint->orientation);
  fVar10 = cosf(keypoint->orientation);
  core::image::draw_line<unsigned_char>
            (image,(int)(keypoint->x + 0.5),(int)(keypoint->y + 0.5),
             (int)(fVar10 * keypoint->radius + keypoint->x + 0.5),
             (int)(fVar9 * keypoint->radius + keypoint->y + 0.5),color);
  return;
}

Assistant:

void
Visualizer::draw_keypoint (core::ByteImage& image,
    Visualizer::Keypoint const& keypoint, Visualizer::KeypointStyle style,
    uint8_t const* color)
{
    int const x = static_cast<int>(keypoint.x + 0.5);
    int const y = static_cast<int>(keypoint.y + 0.5);
    int const width = image.width();
    int const height = image.height();
    int const channels = image.channels();

    if (x < 0 || x >= width || y < 0 || y >= height)
        return;

    int required_space = 0;
    bool draw_orientation = false;
    switch (style)
    {
        default:
        case SMALL_DOT_STATIC:
            required_space = 0;
            draw_orientation = false;
            break;
        case SMALL_CIRCLE_STATIC:
            required_space = 3;
            draw_orientation = false;
            break;
        case RADIUS_BOX_ORIENTATION:
            required_space = static_cast<int>(std::sqrt
                (2.0f * keypoint.radius * keypoint.radius)) + 1;
            draw_orientation = true;
            break;
        case RADIUS_CIRCLE_ORIENTATION:
            required_space = static_cast<int>(keypoint.radius);
            draw_orientation = true;
            break;
    }

    if (x < required_space || x >= width - required_space
        || y < required_space || y >= height - required_space)
    {
        style = SMALL_DOT_STATIC;
        required_space = 0;
        draw_orientation = false;
    }

    switch (style)
    {
        default:
        case SMALL_DOT_STATIC:
            std::copy(color, color + channels, &image.at(x, y, 0));
            break;
        case SMALL_CIRCLE_STATIC:
            core::image::draw_circle(image, x, y, 3, color);
            break;
        case RADIUS_BOX_ORIENTATION:
            draw_box(image, keypoint.x, keypoint.y,
                keypoint.radius, keypoint.orientation, color);
            break;
        case RADIUS_CIRCLE_ORIENTATION:
            core::image::draw_circle(image, x, y, required_space, color);
            break;
    }

    if (draw_orientation)
    {
        float const sin_ori = std::sin(keypoint.orientation);
        float const cos_ori = std::cos(keypoint.orientation);
        float const x1 = (cos_ori * keypoint.radius);
        float const y1 = (sin_ori * keypoint.radius);
        core::image::draw_line(image, static_cast<int>(keypoint.x + 0.5f),
            static_cast<int>(keypoint.y + 0.5f),
            static_cast<int>(keypoint.x + x1 + 0.5f),
            static_cast<int>(keypoint.y + y1 + 0.5f), color);
    }
}